

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

void message_add(char *str,uint16_t type)

{
  message_t *pmVar1;
  msgqueue_t *pmVar2;
  int iVar3;
  _message_t *p_Var4;
  char *pcVar5;
  uint uVar6;
  message_t *old_tail;
  _message_t *p;
  
  pmVar1 = messages->head;
  if ((((pmVar1 != (message_t *)0x0) && (pmVar1->type == type)) &&
      (iVar3 = strcmp(pmVar1->str,str), iVar3 == 0)) && (pmVar1->count != 0xffff)) {
    pmVar1->count = pmVar1->count + 1;
    return;
  }
  p_Var4 = (_message_t *)mem_zalloc(0x20);
  pcVar5 = string_make(str);
  p_Var4->str = pcVar5;
  p_Var4->type = type;
  p_Var4->count = 1;
  pmVar2 = messages;
  pmVar1 = messages->head;
  p_Var4->older = pmVar1;
  if (pmVar1 != (message_t *)0x0) {
    pmVar1->newer = p_Var4;
  }
  pmVar2->head = p_Var4;
  uVar6 = pmVar2->count + 1;
  pmVar2->count = uVar6;
  p = pmVar2->tail;
  if (pmVar2->tail == (_message_t *)0x0) {
    pmVar2->tail = p_Var4;
    p = p_Var4;
  }
  if (pmVar2->max < uVar6) {
    p_Var4 = p->newer;
    pmVar2->tail = p_Var4;
    p_Var4->older = (_message_t *)0x0;
    mem_free(p->str);
    mem_free(p);
    messages->count = messages->count - 1;
  }
  return;
}

Assistant:

void message_add(const char *str, uint16_t type)
{
	message_t *m;

	if (messages->head &&
	    messages->head->type == type &&
	    streq(messages->head->str, str) &&
	    messages->head->count != (uint16_t)-1) {
		messages->head->count++;
		return;
	}

	m = mem_zalloc(sizeof(message_t));
	m->str = string_make(str);
	m->type = type;
	m->count = 1;
	m->older = messages->head;

	if (messages->head)
		messages->head->newer = m;

	messages->head = m;
	messages->count++;

	if (!messages->tail)
		messages->tail = m;

	if (messages->count > messages->max) {
		message_t *old_tail = messages->tail;

		messages->tail = old_tail->newer;
		messages->tail->older = NULL;
		mem_free(old_tail->str);
		mem_free(old_tail);
		messages->count--;
	}
}